

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O2

void __thiscall
mario::EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  pointer peVar1;
  ulong uVar2;
  ulong uVar3;
  Channel *channel;
  value_type local_30;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numEvents;
  if (numEvents < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0xc - uVar3 != 0; uVar3 = uVar3 + 0xc) {
    peVar1 = (this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_30 = *(value_type *)((long)&peVar1->data + uVar3);
    local_30->_revents = *(int *)((long)&peVar1->events + uVar3);
    std::vector<mario::Channel_*,_std::allocator<mario::Channel_*>_>::push_back
              (activeChannels,&local_30);
  }
  return;
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for (int i = 0; i < numEvents; ++i) {
        Channel* channel = static_cast<Channel*>(_events[i].data.ptr);
        channel->setRevents(_events[i].events);
        activeChannels->push_back(channel);
    }
}